

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::operator+=(BN *this,BN *bn)

{
  ushort uVar1;
  value_type vVar2;
  uint uVar3;
  unsigned_long *puVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  ulong local_40;
  size_t pos_1;
  size_t pos;
  size_type sStack_28;
  bt2 sum;
  size_type local_20;
  BN *local_18;
  BN *bn_local;
  BN *this_local;
  
  local_18 = bn;
  bn_local = this;
  local_20 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
  sStack_28 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_18->ba);
  puVar4 = std::max<unsigned_long>(&local_20,&stack0xffffffffffffffd8);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->ba,*puVar4);
  pos._4_4_ = 0;
  pos_1 = 0;
  while( true ) {
    sVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_18->ba);
    if (sVar5 <= pos_1) break;
    uVar3 = pos._4_4_ >> 0x10;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->ba,pos_1);
    uVar1 = *pvVar6;
    pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&local_18->ba,pos_1);
    pos._4_4_ = uVar3 + uVar1 + (uint)*pvVar7;
    vVar2 = (value_type)pos._4_4_;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->ba,pos_1);
    *pvVar6 = vVar2;
    pos_1 = pos_1 + 1;
  }
  local_40 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_18->ba);
  while( true ) {
    sVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->ba);
    if (sVar5 <= local_40) break;
    uVar3 = pos._4_4_ >> 0x10;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->ba,local_40);
    pos._4_4_ = uVar3 + *pvVar6;
    vVar2 = (value_type)pos._4_4_;
    pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       (&this->ba,local_40);
    *pvVar6 = vVar2;
    local_40 = local_40 + 1;
  }
  pos._4_4_ = pos._4_4_ >> 0x10;
  if (pos._4_4_ != 0) {
    std::vector<unsigned_short,std::allocator<unsigned_short>>::emplace_back<unsigned_int&>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)this,
               (uint *)((long)&pos + 4));
  }
  return this;
}

Assistant:

BN& BN::operator += (const BN& bn) {
    ba.resize(max(ba.size(), bn.ba.size()));

    bt2 sum = 0;
    for(size_t pos = 0; pos < bn.ba.size(); pos++) {
        sum = (sum >> bz8) + ba[pos] + bn.ba[pos];
        ba[pos] = sum;
    }

    for(size_t pos = bn.ba.size(); pos < ba.size(); pos++) {
        sum = (sum >> bz8) + ba[pos];
        ba[pos] = sum;
    }
    sum >>= bz8;
    if (sum)
        ba.emplace_back(sum);
    return *this;
}